

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O1

QAction * __thiscall QtMWidgets::ToolBar::addAction(ToolBar *this,QIcon *icon)

{
  QAction *this_00;
  QString local_38;
  
  this_00 = (QAction *)operator_new(0x10);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  QAction::QAction(this_00,icon,&local_38,(QObject *)this);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::addAction((QAction *)this);
  return this_00;
}

Assistant:

QAction *
ToolBar::addAction( const QIcon & icon )
{
	QAction * action = new QAction( icon, QString(), this );
	addAction( action );
	return action;
}